

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O2

type __thiscall
chrono::ChClassRegistration<chrono::geometry::ChLineSegment>::
_create<chrono::geometry::ChLineSegment>(ChClassRegistration<chrono::geometry::ChLineSegment> *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 *puVar4;
  
  puVar4 = (undefined8 *)::operator_new(0x40);
  *(undefined1 *)(puVar4 + 1) = 0;
  *(undefined4 *)((long)puVar4 + 0xc) = 2;
  auVar1._8_8_ = DAT_011dd3e0;
  auVar1._0_8_ = VNULL;
  auVar3._8_8_ = DAT_011dd3e8;
  auVar3._0_8_ = DAT_011dd3e0;
  *puVar4 = &PTR__ChGeometry_01189830;
  auVar2 = vunpcklpd_avx(auVar1,auVar3);
  auVar1 = vshufpd_avx(auVar3,auVar1,1);
  *(undefined1 (*) [16])(puVar4 + 4) = auVar1;
  *(undefined1 (*) [16])(puVar4 + 2) = auVar2;
  *(undefined1 (*) [16])(puVar4 + 6) = auVar3;
  return puVar4;
}

Assistant:

typename enable_if< std::is_default_constructible<Tc>::value, void* >::type
    _create() {
        return reinterpret_cast<void*>(new Tc);
    }